

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O2

void printr<ft::list<int,ft::allocator<int>>>(list<int,_ft::allocator<int>_> *t,char *s)

{
  node *pnVar1;
  ostream *poVar2;
  node **ppnVar3;
  
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 3;
  poVar2 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar2," in reverse:");
  ppnVar3 = &t->m_tail;
  while (pnVar1 = *ppnVar3, pnVar1 != t->m_head->next) {
    poVar2 = std::operator<<((ostream *)&std::cout,' ');
    std::ostream::operator<<(poVar2,pnVar1->prev->data);
    ppnVar3 = &pnVar1->prev;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	printr(T const & t, char const * s) {
	typename T::const_reverse_iterator	itr;

	std::cout << std::setw(3) << s << " in reverse:";
	for (itr = t.rbegin(); itr != t.rend(); ++itr)
		std::cout << ' ' << *itr;
	std::cout << std::endl;
}